

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_set.h
# Opt level: O2

bool __thiscall
wasm::
SmallSetBase<wasm::HeapType,_5UL,_wasm::UnorderedFixedStorage<wasm::HeapType,_5UL>,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>
::
IteratorBase<wasm::SmallSetBase<wasm::HeapType,_5UL,_wasm::UnorderedFixedStorage<wasm::HeapType,_5UL>,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>,_std::__detail::_Node_const_iterator<wasm::HeapType,_true,_true>_>
::operator==(IteratorBase<wasm::SmallSetBase<wasm::HeapType,_5UL,_wasm::UnorderedFixedStorage<wasm::HeapType,_5UL>,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>,_std::__detail::_Node_const_iterator<wasm::HeapType,_true,_true>_>
             *this,Iterator *other)

{
  bool bVar1;
  Fatal local_198;
  
  if (this->parent == other->parent) {
    if (this->usingFixed != other->usingFixed) {
      Fatal::Fatal(&local_198);
      Fatal::operator<<(&local_198,
                        (char (*) [50])"SmallSet does not support changes while iterating");
      Fatal::~Fatal(&local_198);
    }
    if (this->usingFixed == false) {
      bVar1 = (this->flexibleIterator).super__Node_iterator_base<wasm::HeapType,_true>._M_cur ==
              (other->flexibleIterator).super__Node_iterator_base<wasm::HeapType,_true>._M_cur;
    }
    else {
      bVar1 = this->fixedIndex == other->fixedIndex;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool operator==(const Iterator& other) const {
      if (parent != other.parent) {
        return false;
      }
      // std::set allows changes while iterating. For us here, though, it would
      // be nontrivial to support that given we have two iterators that we
      // generalize over (switching "in the middle" would not be easy or fast),
      // so error on that.
      if (usingFixed != other.usingFixed) {
        Fatal() << "SmallSet does not support changes while iterating";
      }
      if (usingFixed) {
        return fixedIndex == other.fixedIndex;
      } else {
        return flexibleIterator == other.flexibleIterator;
      }
    }